

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

float tcu::bilinearInterpolate(Vec4 *values,float x,float y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float res;
  float v11;
  float v01;
  float v10;
  float v00;
  float y_local;
  float x_local;
  Vec4 *values_local;
  
  pfVar4 = Vector<float,_4>::operator[](values,0);
  fVar1 = *pfVar4;
  pfVar4 = Vector<float,_4>::operator[](values,1);
  fVar2 = *pfVar4;
  pfVar4 = Vector<float,_4>::operator[](values,2);
  fVar3 = *pfVar4;
  pfVar4 = Vector<float,_4>::operator[](values,3);
  return *pfVar4 * x * y +
         fVar3 * (1.0 - x) * y + fVar1 * (1.0 - x) * (1.0 - y) + fVar2 * x * (1.0 - y);
}

Assistant:

static float bilinearInterpolate (const Vec4& values, const float x, const float y)
{
	const float		v00		= values[0];
	const float		v10		= values[1];
	const float		v01		= values[2];
	const float		v11		= values[3];
	const float		res		= v00*(1.0f-x)*(1.0f-y) + v10*x*(1.0f-y) + v01*(1.0f-x)*y + v11*x*y;
	return res;
}